

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_resolve.cpp
# Opt level: O2

bool __thiscall
BamTools::ResolveTool::StatsFileReader::Read
          (StatsFileReader *this,ResolveSettings *settings,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ReadGroupResolver,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ReadGroupResolver>_>_>
          *readGroups)

{
  int iVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  string *this_00;
  bool bVar5;
  string line;
  string local_50;
  
  cVar2 = std::__basic_file<char>::is_open();
  iVar4 = 0;
  bVar5 = false;
  if (settings != (ResolveSettings *)0x0 && cVar2 == '\x01') {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ReadGroupResolver>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ReadGroupResolver>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ReadGroupResolver>_>_>
    ::clear(&readGroups->_M_t);
    SkipCommentsAndWhitespace_abi_cxx11_(&line,this);
    while (bVar5 = line._M_string_length == 0, !bVar5) {
      bVar3 = Utilities::StartsWith(&line,&INPUT_TOKEN_abi_cxx11_);
      iVar1 = 1;
      if (!bVar3) {
        bVar3 = Utilities::StartsWith(&line,&OPTIONS_TOKEN_abi_cxx11_);
        iVar1 = 2;
        if (!bVar3) {
          this_00 = &line;
          bVar3 = Utilities::StartsWith(&line,&READGROUPS_TOKEN_abi_cxx11_);
          iVar1 = 3;
          if ((!bVar3) && (iVar1 = iVar4, iVar4 != 1)) {
            if (iVar4 == 3) {
              bVar3 = ParseReadGroupLine((StatsFileReader *)this_00,&line,readGroups);
              iVar1 = 3;
            }
            else {
              if (iVar4 != 2) break;
              bVar3 = ParseOptionLine((StatsFileReader *)this_00,&line,settings);
              iVar1 = 2;
            }
            if (bVar3 == false) break;
          }
        }
      }
      iVar4 = iVar1;
      SkipCommentsAndWhitespace_abi_cxx11_(&local_50,this);
      std::__cxx11::string::operator=((string *)&line,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    std::__cxx11::string::~string((string *)&line);
  }
  return bVar5;
}

Assistant:

bool ResolveTool::StatsFileReader::Read(ResolveTool::ResolveSettings* settings,
                                        std::map<std::string, ReadGroupResolver>& readGroups)
{
    // up-front sanity checks
    if (!m_stream.is_open() || settings == 0) return false;

    // clear out read group data
    readGroups.clear();

    // initialize state
    State currentState = StatsFileReader::None;

    // read stats file
    std::string line = SkipCommentsAndWhitespace();
    while (!line.empty()) {

        bool foundError = false;

        // switch state on keyword found
        if (Utilities::StartsWith(line, INPUT_TOKEN))
            currentState = StatsFileReader::InInput;
        else if (Utilities::StartsWith(line, OPTIONS_TOKEN))
            currentState = StatsFileReader::InOptions;
        else if (Utilities::StartsWith(line, READGROUPS_TOKEN))
            currentState = StatsFileReader::InReadGroups;

        // otherwise parse data line, depending on state
        else {
            if (currentState == StatsFileReader::InInput)
                foundError = !ParseInputLine(line);
            else if (currentState == StatsFileReader::InOptions)
                foundError = !ParseOptionLine(line, settings);
            else if (currentState == StatsFileReader::InReadGroups)
                foundError = !ParseReadGroupLine(line, readGroups);
            else
                foundError = true;
        }

        // break out if error found
        if (foundError) return false;

        // get next line
        line = SkipCommentsAndWhitespace();
    }

    // if here, return success
    return true;
}